

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Definition.cpp
# Opt level: O0

string_view __thiscall slang::ast::Definition::getKindString(Definition *this)

{
  DefinitionKind DVar1;
  logic_error *this_00;
  string_view sVar2;
  string local_f8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Definition *local_20;
  Definition *this_local;
  char *local_10;
  
  DVar1 = this->definitionKind;
  local_20 = this;
  if (DVar1 == Module) {
    _this_local = sv("module",6);
  }
  else if (DVar1 == Interface) {
    _this_local = sv("interface",9);
  }
  else {
    if (DVar1 != Program) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Definition.cpp"
                 ,&local_c1);
      std::operator+(&local_a0,&local_c0,":");
      std::__cxx11::to_string(&local_f8,0x9f);
      std::operator+(&local_80,&local_a0,&local_f8);
      std::operator+(&local_60,&local_80,": ");
      std::operator+(&local_40,&local_60,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    _this_local = sv("program",7);
  }
  sVar2._M_len = (size_t)this_local;
  sVar2._M_str = local_10;
  return sVar2;
}

Assistant:

string_view Definition::getKindString() const {
    switch (definitionKind) {
        case DefinitionKind::Module:
            return "module"sv;
        case DefinitionKind::Interface:
            return "interface"sv;
        case DefinitionKind::Program:
            return "program"sv;
        default:
            ASSUME_UNREACHABLE;
    }
}